

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

void ipc_on_connection(uv_stream_t *server,int status)

{
  undefined1 auVar1 [16];
  undefined8 local_28;
  uv_buf_t buf;
  int r;
  int status_local;
  uv_stream_t *server_local;
  
  if (connection_accepted == 0) {
    buf.len._4_4_ = status;
    if (status != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x29e,"status == 0");
      abort();
    }
    if (server != (uv_stream_t *)&tcp_server) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x29f,"(uv_stream_t*)&tcp_server == server");
      abort();
    }
    buf.len._0_4_ = uv_tcp_init(tcp_server.loop,0x2cef90);
    if ((int)buf.len != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x2a2,"r == 0");
      abort();
    }
    buf.len._0_4_ = uv_accept(&tcp_server,0x2cef90);
    if ((int)buf.len != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x2a5,"r == 0");
      abort();
    }
    uv_close(0x2cef90,close_cb);
    auVar1 = uv_buf_init("accepted_connection\n",0x14);
    buf.base = auVar1._8_8_;
    local_28 = auVar1._0_8_;
    buf.len._0_4_ = uv_write2(&conn_notify_req,&channel,&local_28,1,0,conn_notify_write_cb);
    if ((int)buf.len != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x2ac,"r == 0");
      abort();
    }
    connection_accepted = 1;
  }
  return;
}

Assistant:

static void ipc_on_connection(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;

  if (!connection_accepted) {
    /*
     * Accept the connection and close it.  Also let the other
     * side know.
     */
    ASSERT(status == 0);
    ASSERT((uv_stream_t*)&tcp_server == server);

    r = uv_tcp_init(server->loop, &conn.conn);
    ASSERT(r == 0);

    r = uv_accept(server, (uv_stream_t*)&conn.conn);
    ASSERT(r == 0);

    uv_close((uv_handle_t*)&conn.conn, close_cb);

    buf = uv_buf_init("accepted_connection\n", 20);
    r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
      NULL, conn_notify_write_cb);
    ASSERT(r == 0);

    connection_accepted = 1;
  }
}